

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.cpp
# Opt level: O2

void __thiscall
WordSplitSVTest_single_word_trailing_delim_Test<char16_t>::TestBody
          (WordSplitSVTest_single_word_trailing_delim_Test<char16_t> *this)

{
  char *pcVar1;
  int local_70 [2];
  long *local_68;
  AssertionResult gtest_ar;
  vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  split_result;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> word;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> single_word;
  
  make_word<char16_t,std::__cxx11::u16string>(&word,8,L'\0');
  std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
  push_back(&word,L'\0');
  single_word._M_len = word._M_string_length;
  single_word._M_str = word._M_dataplus._M_p;
  jessilib::word_split<std::vector,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>_>
            (&split_result,&single_word,L'\0');
  local_68 = (long *)((long)split_result.
                            super__Vector_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)split_result.
                            super__Vector_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5);
  local_70[0] = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"split_result.size()","1",(unsigned_long *)&local_68,local_70);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_68);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0x4f,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_70,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_70);
    if (local_68 != (long *)0x0) {
      (**(code **)(*local_68 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_68 = (long *)(split_result.
                      super__Vector_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
  local_70[0] = 8;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"split_result[0].size()","8",(unsigned_long *)&local_68,local_70)
  ;
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_68);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0x50,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_70,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_70);
    if (local_68 != (long *)0x0) {
      (**(code **)(*local_68 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::
  vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  ::~vector(&split_result);
  std::__cxx11::u16string::~u16string((u16string *)&word);
  return;
}

Assistant:

TYPED_TEST(WordSplitSVTest, single_word_trailing_delim) {
	auto word = make_word<TypeParam>();
	word += default_delim<TypeParam>;
	std::basic_string_view<TypeParam> single_word = word;
	std::vector<std::basic_string<TypeParam>> split_result = word_split(single_word, default_delim<TypeParam>);
	EXPECT_EQ(split_result.size(), 1);
	EXPECT_EQ(split_result[0].size(), 8);
}